

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_gate.c
# Opt level: O0

void dispatch_socket_message(gate *g,skynet_socket_message *message,int sz)

{
  skynet_context *context;
  int iVar1;
  connection *pcVar2;
  connection *c_3;
  connection *c_2;
  int id_2;
  connection *c_1;
  int id_1;
  connection *c;
  int id;
  skynet_context *ctx;
  int sz_local;
  skynet_socket_message *message_local;
  gate *g_local;
  
  context = g->ctx;
  switch(message->type) {
  case 1:
    iVar1 = hashid_lookup(&g->hash,message->id);
    if (iVar1 < 0) {
      skynet_error(context,"Drop unknown connection %d message",(ulong)(uint)message->id);
      skynet_socket_close(context,message->id);
      free(message->buffer);
    }
    else {
      dispatch_message(g,g->conn + iVar1,message->id,message->buffer,message->ud);
    }
    break;
  case 2:
    if (message->id != g->listen_id) {
      iVar1 = hashid_lookup(&g->hash,message->id);
      if (iVar1 < 0) {
        skynet_error(context,"Close unknown connection %d",(ulong)(uint)message->id);
        skynet_socket_close(context,message->id);
      }
      else {
        _report(g,"%d open %d %s:0",(ulong)(uint)message->id,(ulong)(uint)message->id,
                g->conn[iVar1].remote_name);
      }
    }
    break;
  case 3:
  case 5:
    iVar1 = hashid_remove(&g->hash,message->id);
    if (-1 < iVar1) {
      pcVar2 = g->conn + iVar1;
      databuffer_clear(&pcVar2->buffer,&g->mp);
      memset(pcVar2,0,0x50);
      pcVar2->id = -1;
      _report(g,"%d close",(ulong)(uint)message->id);
    }
    break;
  case 4:
    if (g->listen_id != message->id) {
      __assert_fail("g->listen_id == message->id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/service-src/service_gate.c"
                    ,0xfb,
                    "void dispatch_socket_message(struct gate *, const struct skynet_socket_message *, int)"
                   );
    }
    iVar1 = hashid_full(&g->hash);
    if (iVar1 == 0) {
      pcVar2 = g->conn;
      iVar1 = hashid_insert(&g->hash,message->ud);
      pcVar2 = pcVar2 + iVar1;
      ctx._4_4_ = sz;
      if (0x1f < (uint)sz) {
        ctx._4_4_ = 0x1f;
      }
      pcVar2->id = message->ud;
      memcpy(pcVar2->remote_name,message + 1,(long)ctx._4_4_);
      pcVar2->remote_name[ctx._4_4_] = '\0';
      skynet_socket_start(context,message->ud);
    }
    else {
      skynet_socket_close(context,message->ud);
    }
    break;
  case 7:
    skynet_error(context,"fd (%d) send buffer (%d)K",(ulong)(uint)message->id,
                 (ulong)(uint)message->ud);
  }
  return;
}

Assistant:

static void
dispatch_socket_message(struct gate *g, const struct skynet_socket_message * message, int sz) {
	struct skynet_context * ctx = g->ctx;
	switch(message->type) {
	case SKYNET_SOCKET_TYPE_DATA: {
		int id = hashid_lookup(&g->hash, message->id);
		if (id>=0) {
			struct connection *c = &g->conn[id];
			dispatch_message(g, c, message->id, message->buffer, message->ud);
		} else {
			skynet_error(ctx, "Drop unknown connection %d message", message->id);
			skynet_socket_close(ctx, message->id);
			skynet_free(message->buffer);
		}
		break;
	}
	case SKYNET_SOCKET_TYPE_CONNECT: {
		if (message->id == g->listen_id) {
			// start listening
			break;
		}
		int id = hashid_lookup(&g->hash, message->id);
		if (id>=0) {
			struct connection *c = &g->conn[id];
			_report(g, "%d open %d %s:0",message->id,message->id,c->remote_name);
		} else {
			skynet_error(ctx, "Close unknown connection %d", message->id);
			skynet_socket_close(ctx, message->id);
		}
		break;
	}
	case SKYNET_SOCKET_TYPE_CLOSE:
	case SKYNET_SOCKET_TYPE_ERROR: {
		int id = hashid_remove(&g->hash, message->id);
		if (id>=0) {
			struct connection *c = &g->conn[id];
			databuffer_clear(&c->buffer,&g->mp);
			memset(c, 0, sizeof(*c));
			c->id = -1;
			_report(g, "%d close", message->id);
		}
		break;
	}
	case SKYNET_SOCKET_TYPE_ACCEPT:
		// report accept, then it will be get a SKYNET_SOCKET_TYPE_CONNECT message
		assert(g->listen_id == message->id);
		if (hashid_full(&g->hash)) {
			skynet_socket_close(ctx, message->ud);
		} else {
			struct connection *c = &g->conn[hashid_insert(&g->hash, message->ud)];
			if (sz >= sizeof(c->remote_name)) {
				sz = sizeof(c->remote_name) - 1;
			}
			c->id = message->ud;
			memcpy(c->remote_name, message+1, sz);
			c->remote_name[sz] = '\0';
			skynet_socket_start(ctx, message->ud);
		}
		break;
	case SKYNET_SOCKET_TYPE_WARNING:
		skynet_error(ctx, "fd (%d) send buffer (%d)K", message->id, message->ud);
		break;
	}
}